

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChPlasticityCosserat::ComputeStiffnessMatrixElastoplastic
          (ChPlasticityCosserat *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_n,
          ChVector<double> *strain_m,ChBeamMaterialInternalData *data)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  int i;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ChVector<double> v;
  double local_168 [4];
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  double local_c8 [4];
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  b_plastic_data;
  ChVector<double> me_strain_m_new;
  ChVector<double> me_strain_n_new;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  a_plastic_data;
  
  astress_n.m_data[2] = 0.0;
  astress_m.m_data[2] = 0.0;
  me_strain_n_new.m_data[2] = 0.0;
  me_strain_m_new.m_data[2] = 0.0;
  astress_n.m_data[0] = 0.0;
  astress_n.m_data[1] = 0.0;
  astress_m.m_data[0] = 0.0;
  astress_m.m_data[1] = 0.0;
  me_strain_n_new.m_data[0] = 0.0;
  me_strain_n_new.m_data[1] = 0.0;
  me_strain_m_new.m_data[0] = 0.0;
  me_strain_m_new.m_data[1] = 0.0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*this->_vptr_ChPlasticityCosserat[4])(this,1);
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityCosserat[4])(this,1);
  iVar10 = (*this->_vptr_ChPlasticityCosserat[2])
                     (this,&astress_n,&astress_m,&me_strain_n_new,&me_strain_m_new,
                      ((a_plastic_data.
                        super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                      .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                      _M_head_impl,strain_n,strain_m,data);
  if ((char)iVar10 == '\0') {
    peVar1 = (this->section->elasticity).
             super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_00 = (this->section->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChElasticityCosserat[3])(peVar1,K,strain_n,strain_m);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    lVar13 = 0;
    bstress_n.m_data[0] = 0.0;
    bstress_n.m_data[1] = 0.0;
    bstress_n.m_data[2] = 0.0;
    bstress_m.m_data[2] = 0.0;
    bstress_m.m_data[0] = 0.0;
    bstress_m.m_data[1] = 0.0;
    local_168[0] = strain_n->m_data[0];
    local_168[1] = strain_n->m_data[1];
    local_168[2] = strain_n->m_data[2];
    local_c8[0] = strain_m->m_data[0];
    local_c8[1] = strain_m->m_data[1];
    local_c8[2] = strain_m->m_data[2];
    pdVar12 = (double *)K;
    do {
      local_168[lVar13] = local_168[lVar13] + 1e-06;
      iVar10 = (*this->_vptr_ChPlasticityCosserat[2])
                         (this,&bstress_n,&bstress_m,&me_strain_n_new,&me_strain_m_new,
                          ((b_plastic_data.
                            super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                          .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                          _M_head_impl,local_168,local_c8,data);
      auVar4._8_8_ = bstress_n.m_data[1];
      auVar4._0_8_ = bstress_n.m_data[0];
      uVar11 = CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),7);
      auVar8._8_8_ = astress_n.m_data[1];
      auVar8._0_8_ = astress_n.m_data[0];
      auVar2 = vsubpd_avx(auVar4,auVar8);
      v.m_data[0] = auVar2._0_8_;
      v.m_data[1] = auVar2._8_8_;
      auVar14._0_8_ = v.m_data[0] * 1000000.0;
      auVar14._8_8_ = (double)((ulong)((byte)(uVar11 >> 1) & 1) * (long)v.m_data[1]) * 1000000.0;
      auVar14._16_8_ =
           (double)((ulong)((byte)(uVar11 >> 2) & 1) *
                   (long)(bstress_n.m_data[2] - astress_n.m_data[2])) * 1000000.0;
      auVar14._24_8_ = 0;
      vscatterqpd_avx512vl(ZEXT832(pdVar12) + _DAT_0096bbc0,uVar11,auVar14);
      auVar2._8_8_ = bstress_m.m_data[1];
      auVar2._0_8_ = bstress_m.m_data[0];
      auVar6._8_8_ = astress_m.m_data[1];
      auVar6._0_8_ = astress_m.m_data[0];
      auVar2 = vsubpd_avx(auVar2,auVar6);
      v.m_data[0] = auVar2._0_8_;
      v.m_data[1] = auVar2._8_8_;
      auVar15._0_8_ = v.m_data[0] * 1000000.0;
      auVar15._8_8_ = (double)((ulong)((byte)(uVar11 >> 1) & 1) * (long)v.m_data[1]) * 1000000.0;
      auVar15._16_8_ =
           (double)((ulong)((byte)(uVar11 >> 2) & 1) *
                   (long)(bstress_m.m_data[2] - astress_m.m_data[2])) * 1000000.0;
      auVar15._24_8_ = 0;
      vscatterqpd_avx512vl(ZEXT832(pdVar12) + ZEXT832(0x90) + _DAT_0096bbc0,uVar11,auVar15);
      pdVar12 = pdVar12 + 1;
      local_168[lVar13] = local_168[lVar13] + -1e-06;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    pdVar12 = (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
              array + 0x15;
    lVar13 = 0;
    do {
      local_c8[lVar13] = local_c8[lVar13] + 1e-06;
      iVar10 = (*this->_vptr_ChPlasticityCosserat[2])
                         (this,&bstress_n,&bstress_m,&me_strain_n_new,&me_strain_m_new,
                          ((b_plastic_data.
                            super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                          .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                          _M_head_impl,local_168,local_c8,data);
      auVar5._8_8_ = bstress_n.m_data[1];
      auVar5._0_8_ = bstress_n.m_data[0];
      uVar11 = CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),7);
      auVar9._8_8_ = astress_n.m_data[1];
      auVar9._0_8_ = astress_n.m_data[0];
      auVar2 = vsubpd_avx(auVar5,auVar9);
      v.m_data[0] = auVar2._0_8_;
      v.m_data[1] = auVar2._8_8_;
      auVar16._0_8_ = v.m_data[0] * 1000000.0;
      auVar16._8_8_ = (double)((ulong)((byte)(uVar11 >> 1) & 1) * (long)v.m_data[1]) * 1000000.0;
      auVar16._16_8_ =
           (double)((ulong)((byte)(uVar11 >> 2) & 1) *
                   (long)(bstress_n.m_data[2] - astress_n.m_data[2])) * 1000000.0;
      auVar16._24_8_ = 0;
      vscatterqpd_avx512vl
                (ZEXT832(pdVar12) + ZEXT832(0xffffffffffffff70) + _DAT_0096bbc0,uVar11,auVar16);
      auVar3._8_8_ = bstress_m.m_data[1];
      auVar3._0_8_ = bstress_m.m_data[0];
      auVar7._8_8_ = astress_m.m_data[1];
      auVar7._0_8_ = astress_m.m_data[0];
      auVar2 = vsubpd_avx(auVar3,auVar7);
      v.m_data[0] = auVar2._0_8_;
      v.m_data[1] = auVar2._8_8_;
      auVar17._0_8_ = v.m_data[0] * 1000000.0;
      auVar17._8_8_ = (double)((ulong)((byte)(uVar11 >> 1) & 1) * (long)v.m_data[1]) * 1000000.0;
      auVar17._16_8_ =
           (double)((ulong)((byte)(uVar11 >> 2) & 1) *
                   (long)(bstress_m.m_data[2] - astress_m.m_data[2])) * 1000000.0;
      auVar17._24_8_ = 0;
      vscatterqpd_avx512vl(ZEXT832(pdVar12) + ZEXT832(0) + _DAT_0096bbc0,uVar11,auVar17);
      pdVar12 = pdVar12 + 1;
      local_c8[lVar13] = local_c8[lVar13] + -1e-06;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
  }
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::~vector(&b_plastic_data);
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::~vector(&a_plastic_data);
  return;
}

Assistant:

void ChPlasticityCosserat::ComputeStiffnessMatrixElastoplastic(ChMatrixNM<double, 6, 6>& K,
                                                               const ChVector<>& strain_n,
                                                               const ChVector<>& strain_m,
                                                               const ChBeamMaterialInternalData& data) {
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> me_strain_n_new;  // needed only as placeholder
    ChVector<> me_strain_m_new;  // needed only as placeholder

    std::vector<std::unique_ptr<ChBeamMaterialInternalData>> a_plastic_data;
    this->CreatePlasticityData(1, a_plastic_data);
    std::vector<std::unique_ptr<ChBeamMaterialInternalData>> b_plastic_data;
    this->CreatePlasticityData(1, b_plastic_data);

    bool in_plastic = ComputeStressWithReturnMapping(astress_n, astress_m, me_strain_n_new, me_strain_m_new,
                                                     *a_plastic_data[0], strain_n, strain_m, data);

    if (!in_plastic) {
        // if no return mapping is needed at this strain state, just use elastic matrix:
        return this->section->GetElasticity()->ComputeStiffnessMatrix(K, strain_n, strain_m);
    } else {
        // if return mapping is needed at this strain state, compute the elastoplastic stiffness by brute force BDF
        double epsi = 1e-6;
        double invepsi = 1.0 / epsi;
        ChVector<> bstress_n;
        ChVector<> bstress_m;
        ChVector<> strain_n_inc = strain_n;
        ChVector<> strain_m_inc = strain_m;
        for (int i = 0; i < 3; ++i) {
            strain_n_inc[i] += epsi;
            this->ComputeStressWithReturnMapping(bstress_n, bstress_m, me_strain_n_new, me_strain_m_new,
                                                 *b_plastic_data[0], strain_n_inc, strain_m_inc, data);
            K.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
            K.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
            strain_n_inc[i] -= epsi;
        }
        for (int i = 0; i < 3; ++i) {
            strain_m_inc[i] += epsi;
            this->ComputeStressWithReturnMapping(bstress_n, bstress_m, me_strain_n_new, me_strain_m_new,
                                                 *b_plastic_data[0], strain_n_inc, strain_m_inc, data);
            K.block(0, i + 3, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
            K.block(3, i + 3, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
            strain_m_inc[i] -= epsi;
        }
    }
}